

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_pbf_writer.hpp
# Opt level: O2

void __thiscall
protozero::
basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
add_bytes(basic_pbf_writer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,pbf_tag_type tag,char *value,size_t size)

{
  assert_error *this_00;
  
  if (this->m_pos == 0) {
    if (this->m_data == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_00 = (assert_error *)__cxa_allocate_exception(0x10);
      assert_error::assert_error(this_00,"m_data");
    }
    else {
      if (size >> 0x20 == 0) {
        add_length_varint(this,tag,(pbf_length_type)size);
        std::__cxx11::string::append((char *)this->m_data,(ulong)value);
        return;
      }
      this_00 = (assert_error *)__cxa_allocate_exception(0x10);
      assert_error::assert_error(this_00,"size <= std::numeric_limits<pbf_length_type>::max()");
    }
  }
  else {
    this_00 = (assert_error *)__cxa_allocate_exception(0x10);
    assert_error::assert_error
              (this_00,
               "m_pos == 0 && \"you can\'t add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage\""
              );
  }
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void add_bytes(pbf_tag_type tag, const char* value, std::size_t size) {
        protozero_assert(m_pos == 0 && "you can't add fields to a parent basic_pbf_writer if there is an existing basic_pbf_writer for a submessage");
        protozero_assert(m_data);
        protozero_assert(size <= std::numeric_limits<pbf_length_type>::max());
        add_length_varint(tag, static_cast<pbf_length_type>(size));
        buffer_customization<TBuffer>::append(m_data, value, size);
    }